

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O1

void display(void)

{
  glClear(0x4100);
  glPushMatrix();
  drawBallHow = DRAW_BALL_SHADOW;
  DrawBoingBall();
  DrawGrid();
  drawBallHow = DRAW_BALL;
  DrawBoingBall();
  glPopMatrix();
  glFlush();
  return;
}

Assistant:

void display(void)
{
   glClear( GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT );
   glPushMatrix();

   drawBallHow = DRAW_BALL_SHADOW;
   DrawBoingBall();

   DrawGrid();

   drawBallHow = DRAW_BALL;
   DrawBoingBall();

   glPopMatrix();
   glFlush();
}